

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O2

bool google::protobuf::internal::ParseAnyTypeUrl
               (string *type_url,string *url_prefix,string *full_type_name)

{
  bool bVar1;
  long lVar2;
  string asStack_48 [32];
  
  lVar2 = std::__cxx11::string::find_last_of((char *)type_url,0x562c57);
  if ((lVar2 == -1) || (lVar2 + 1U == type_url->_M_string_length)) {
    bVar1 = false;
  }
  else {
    if (url_prefix != (string *)0x0) {
      std::__cxx11::string::substr((ulong)asStack_48,(ulong)type_url);
      std::__cxx11::string::operator=((string *)url_prefix,asStack_48);
      std::__cxx11::string::~string(asStack_48);
    }
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)type_url);
    std::__cxx11::string::operator=((string *)full_type_name,asStack_48);
    std::__cxx11::string::~string(asStack_48);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ParseAnyTypeUrl(const std::string& type_url, std::string* url_prefix,
                     std::string* full_type_name) {
  size_t pos = type_url.find_last_of("/");
  if (pos == std::string::npos || pos + 1 == type_url.size()) {
    return false;
  }
  if (url_prefix) {
    *url_prefix = type_url.substr(0, pos + 1);
  }
  *full_type_name = type_url.substr(pos + 1);
  return true;
}